

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines.c
# Opt level: O0

int WebRtcIsac_EncTerminate(Bitstr *streamdata)

{
  char cVar1;
  uint8_t *puVar2;
  uint8_t *local_18;
  uint8_t *stream_ptr;
  Bitstr *streamdata_local;
  
  local_18 = streamdata->stream + streamdata->stream_index;
  if (streamdata->W_upper < 0x2000000) {
    streamdata->streamval = streamdata->streamval + 0x10000;
    if (streamdata->streamval < 0x10000) {
      do {
        cVar1 = local_18[-1];
        local_18[-1] = cVar1 + '\x01';
        local_18 = local_18 + -1;
      } while ((char)(cVar1 + '\x01') == '\0');
      local_18 = streamdata->stream + streamdata->stream_index;
    }
    puVar2 = local_18 + 1;
    *local_18 = (uint8_t)(streamdata->streamval >> 0x18);
    local_18._0_4_ = (int)local_18 + 2;
    *puVar2 = (uint8_t)(streamdata->streamval >> 0x10);
  }
  else {
    streamdata->streamval = streamdata->streamval + 0x1000000;
    if (streamdata->streamval < 0x1000000) {
      do {
        cVar1 = local_18[-1];
        local_18[-1] = cVar1 + '\x01';
        local_18 = local_18 + -1;
      } while ((char)(cVar1 + '\x01') == '\0');
      local_18 = streamdata->stream + streamdata->stream_index;
    }
    *local_18 = (uint8_t)(streamdata->streamval >> 0x18);
    local_18._0_4_ = (int)local_18 + 1;
  }
  return (int)local_18 - (int)streamdata;
}

Assistant:

int WebRtcIsac_EncTerminate(Bitstr *streamdata) /* in-/output struct containing bitstream */
{
  uint8_t *stream_ptr;


  /* point to the right place in the stream buffer */
  stream_ptr = streamdata->stream + streamdata->stream_index;

  /* find minimum length (determined by current interval width) */
  if ( streamdata->W_upper > 0x01FFFFFF )
  {
    streamdata->streamval += 0x01000000;
    /* add carry to buffer */
    if (streamdata->streamval < 0x01000000)
    {
      /* propagate carry */
      while ( !(++(*--stream_ptr)) );
      /* put pointer back to the old value */
      stream_ptr = streamdata->stream + streamdata->stream_index;
    }
    /* write remaining data to bitstream */
    *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);
  }
  else
  {
    streamdata->streamval += 0x00010000;
    /* add carry to buffer */
    if (streamdata->streamval < 0x00010000)
    {
      /* propagate carry */
      while ( !(++(*--stream_ptr)) );
      /* put pointer back to the old value */
      stream_ptr = streamdata->stream + streamdata->stream_index;
    }
    /* write remaining data to bitstream */
    *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);
    *stream_ptr++ = (uint8_t) ((streamdata->streamval >> 16) & 0x00FF);
  }

  /* calculate stream length */
  return (int)(stream_ptr - streamdata->stream);
}